

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O0

void Am_Gesture_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int y_00;
  Am_Input_Char x_00;
  bool bVar1;
  ostream *poVar2;
  Am_Value *pAVar3;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Input_Char local_64;
  int local_60;
  Am_Input_Char ic;
  int y;
  int x;
  Am_Object command_obj;
  Am_Inter_Internal_Method inter_method;
  Am_Object local_30;
  Am_Input_Event *local_28;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *object_local;
  Am_Object *inter_local;
  
  local_28 = ev;
  ev_local = (Am_Input_Event *)event_window;
  event_window_local = object;
  object_local = inter;
  Am_Object::Am_Object(&local_30,inter);
  bVar1 = Am_Inter_Tracing(&local_30);
  Am_Object::~Am_Object(&local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Gesture starting over ");
    poVar2 = operator<<(poVar2,event_window_local);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)&command_obj);
  pAVar3 = Am_Object::Get(&Am_Interactor,0xbe,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&command_obj,pAVar3);
  (*(code *)inter_method.from_wrapper)(object_local,event_window_local,ev_local,local_28);
  Am_Object::Am_Object((Am_Object *)&y);
  ic = (Am_Input_Char)local_28->x;
  local_60 = local_28->y;
  local_64 = local_28->input_char;
  pAVar3 = Am_Object::Get(object_local,0xc5,0);
  Am_Object::operator=((Am_Object *)&y,pAVar3);
  Am_Inter_Call_Both_Method
            (object_local,(Am_Object *)&y,199,(int)ic,local_60,(Am_Object *)ev_local,&local_64,
             event_window_local,&Am_No_Location);
  Am_Object::Am_Object(&local_70,object_local);
  gesture_start(&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Am_Object(&local_78,object_local);
  Am_Object::Am_Object(&local_80,(Am_Object *)&y);
  x_00 = ic;
  y_00 = local_60;
  Am_Object::Am_Object(&local_88,(Am_Object *)ev_local);
  gesture_new_point(&local_78,&local_80,(int)x_00,y_00,&local_88,local_64);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object((Am_Object *)&y);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Gesture_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  if (Am_Inter_Tracing(inter))
    std::cout << "Gesture starting over " << object << std::endl;
  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  int x = ev->x;
  int y = ev->y;
  Am_Input_Char ic = ev->input_char;
  command_obj = inter.Get(Am_COMMAND);

  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ic, object, Am_No_Location);

  gesture_start(inter);
  gesture_new_point(inter, command_obj, x, y, event_window, ic);
}